

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

xmlParserInputPtr resolveEntityDebug(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  callbacks = callbacks + 1;
  fwrite("SAX.resolveEntity(",0x12,1,(FILE *)SAXdebug);
  if (publicId == (xmlChar *)0x0) {
    fputc(0x20,(FILE *)SAXdebug);
  }
  else {
    fputs((char *)publicId,(FILE *)SAXdebug);
  }
  if (systemId == (xmlChar *)0x0) {
    fwrite(", )\n",4,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug,", %s)\n",systemId);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

static xmlParserInputPtr
resolveEntityDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *publicId, const xmlChar *systemId)
{
    callbacks++;
    if (quiet)
	return(NULL);
    /* xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx; */


    fprintf(SAXdebug, "SAX.resolveEntity(");
    if (publicId != NULL)
	fprintf(SAXdebug, "%s", (char *)publicId);
    else
	fprintf(SAXdebug, " ");
    if (systemId != NULL)
	fprintf(SAXdebug, ", %s)\n", (char *)systemId);
    else
	fprintf(SAXdebug, ", )\n");
/*********
    if (systemId != NULL) {
        return(xmlNewInputFromFile(ctxt, (char *) systemId));
    }
 *********/
    return(NULL);
}